

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkCecSat(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConfLimit,int nInsLimit)

{
  int iVar1;
  Abc_Ntk_t *pMiter;
  int *pModel;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  char *__s;
  
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    pcVar2 = "Miter computation has failed.";
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiter);
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        puts("Networks are NOT EQUIVALENT after structural hashing.");
        pModel = Abc_NtkVerifyGetCleanModel(pMiter,1);
        pMiter->pModel = pModel;
        Abc_NtkVerifyReportError(pNtk1,pNtk2,pModel);
        if (pMiter->pModel != (int *)0x0) {
          free(pMiter->pModel);
          pMiter->pModel = (int *)0x0;
        }
      }
      else {
        pNtk = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
        Abc_NtkDelete(pMiter);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar2 = "Renoding for CNF has failed.";
          goto LAB_00282d43;
        }
        iVar1 = Abc_NtkMiterSat(pNtk,(long)nConfLimit,(long)nInsLimit,0,(ABC_INT64_T *)0x0,
                                (ABC_INT64_T *)0x0);
        pcVar2 = "Networks are equivalent after SAT.";
        if (iVar1 == 0) {
          pcVar2 = "Networks are NOT EQUIVALENT after SAT.";
        }
        __s = "Networks are undecided (SAT solver timed out).";
        if (iVar1 != -1) {
          __s = pcVar2;
        }
        puts(__s);
        pMiter = pNtk;
        if (pNtk->pModel != (int *)0x0) {
          Abc_NtkVerifyReportError(pNtk1,pNtk2,pNtk->pModel);
          if (pNtk->pModel != (int *)0x0) {
            free(pNtk->pModel);
            pNtk->pModel = (int *)0x0;
          }
        }
      }
      Abc_NtkDelete(pMiter);
      return;
    }
    Abc_NtkDelete(pMiter);
    pcVar2 = "Networks are equivalent after structural hashing.";
  }
LAB_00282d43:
  puts(pcVar2);
  return;
}

Assistant:

void Abc_NtkCecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit )
{
    extern Abc_Ntk_t * Abc_NtkMulti( Abc_Ntk_t * pNtk, int nThresh, int nFaninMax, int fCnf, int fMulti, int fSimple, int fFactor );
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pCnf;
    int RetValue;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are equivalent after structural hashing.\n" );
        return;
    }

    // convert the miter into a CNF
    pCnf = Abc_NtkMulti( pMiter, 0, 100, 1, 0, 0, 0 );
    Abc_NtkDelete( pMiter );
    if ( pCnf == NULL )
    {
        printf( "Renoding for CNF has failed.\n" );
        return;
    }

    // solve the CNF using the SAT solver
    RetValue = Abc_NtkMiterSat( pCnf, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, 0, NULL, NULL );
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out).\n" );
    else if ( RetValue == 0 )
        printf( "Networks are NOT EQUIVALENT after SAT.\n" );
    else
        printf( "Networks are equivalent after SAT.\n" );
    if ( pCnf->pModel )
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pCnf->pModel );
    ABC_FREE( pCnf->pModel );
    Abc_NtkDelete( pCnf );
}